

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall amrex::EB2::Level::fillBndryCent(Level *this,MultiCutFab *bndrycent,Geometry *geom)

{
  bool bVar1;
  Level *in_RDI;
  MultiFab tmp;
  MFInfo *info;
  DistributionMapping *in_stack_fffffffffffffe20;
  BoxArray *in_stack_fffffffffffffe28;
  FabFactory<amrex::FArrayBox> this_00;
  undefined8 local_1c8;
  Geometry *geom_00;
  pointer bndrycent_00;
  Level *this_01;
  Real in_stack_ffffffffffffff20;
  MultiCutFab *in_stack_ffffffffffffff28;
  MultiFab *in_stack_ffffffffffffff50;
  MultiCutFab *in_stack_ffffffffffffff58;
  
  bVar1 = isAllRegular(in_RDI);
  if (bVar1) {
    MultiCutFab::setVal(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    MultiCutFab::boxArray((MultiCutFab *)0x14a4d8e);
    MultiCutFab::DistributionMap((MultiCutFab *)0x14a4da0);
    MultiCutFab::nComp((MultiCutFab *)0x14a4db2);
    MultiCutFab::nGrow((MultiCutFab *)0x14a4dc3);
    bndrycent_00 = (pointer)0x0;
    this_01 = (Level *)0x0;
    local_1c8._0_1_ = false;
    local_1c8._1_7_ = 0;
    geom_00 = (Geometry *)0x0;
    info = (MFInfo *)&local_1c8;
    MFInfo::MFInfo((MFInfo *)0x14a4dec);
    this_00._vptr_FabFactory = (_func_int **)0x0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)&stack0xfffffffffffffe30);
    MultiFab::MultiFab((MultiFab *)this_00._vptr_FabFactory,in_stack_fffffffffffffe28,
                       in_stack_fffffffffffffe20,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,info,
                       (FabFactory<amrex::FArrayBox> *)geom_00);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x14a4e40);
    MFInfo::~MFInfo((MFInfo *)0x14a4e4a);
    fillBndryCent(this_01,(MultiFab *)bndrycent_00,geom_00);
    anon_unknown_2::copyMultiFabToMultiCutFab(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    MultiFab::~MultiFab((MultiFab *)0x14a4e8a);
  }
  return;
}

Assistant:

void
Level::fillBndryCent (MultiCutFab& bndrycent, const Geometry& geom) const
{
    if (isAllRegular()) {
        bndrycent.setVal(-1.0);
        return;
    }

    MultiFab tmp(bndrycent.boxArray(), bndrycent.DistributionMap(),
                 bndrycent.nComp(), bndrycent.nGrow());
    fillBndryCent(tmp, geom);
    copyMultiFabToMultiCutFab(bndrycent, tmp);
}